

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void choose_tx_size_type_from_rd
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,int64_t ref_best_rd,BLOCK_SIZE bs)

{
  byte bVar1;
  byte bVar2;
  int is_inter;
  int64_t iVar3;
  RD_STATS *in_RDX;
  long in_RSI;
  long in_RDI;
  BLOCK_SIZE in_R8B;
  int64_t rd_thresh;
  RD_STATS this_rd_stats;
  int depth;
  int tx_size;
  TxfmSearchInfo *txfm_info;
  int64_t rd [3];
  int num_blks;
  int64_t best_rd;
  TX_SIZE best_tx_size;
  uint8_t best_blk_skip [1024];
  uint8_t best_txk_type_map [1024];
  int skip_trellis;
  TX_SIZE chosen_tx_size;
  int init_depth;
  int start_tx;
  int tx_select;
  TX_SIZE max_rect_tx_size;
  TxfmSearchParams *txfm_params;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined4 in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff714;
  bool local_8d1;
  undefined1 local_8c0 [40];
  int local_898;
  uint local_894;
  long local_890;
  int64_t local_888 [3];
  int local_86c;
  int64_t local_868;
  byte local_859;
  undefined1 local_858 [62];
  TX_SIZE in_stack_fffffffffffff7e6;
  BLOCK_SIZE in_stack_fffffffffffff7e7;
  int64_t in_stack_fffffffffffff7e8;
  RD_STATS *in_stack_fffffffffffff7f0;
  MACROBLOCK *in_stack_fffffffffffff7f8;
  AV1_COMP *in_stack_fffffffffffff800;
  FAST_TX_SEARCH_MODE in_stack_fffffffffffff820;
  int in_stack_fffffffffffff828;
  undefined1 local_458 [1024];
  undefined4 local_58;
  byte local_51;
  int local_50;
  uint local_4c;
  uint local_48;
  byte local_41;
  long local_40;
  long local_38;
  long local_30;
  BLOCK_SIZE local_21;
  RD_STATS *local_18;
  long local_10;
  long local_8;
  
  local_21 = in_R8B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  av1_invalid_rd_stats(in_RDX);
  local_30 = local_10 + 0x1a0;
  local_38 = **(long **)(local_10 + 0x2058);
  local_40 = local_10 + 0x24dcc;
  local_41 = ""[local_21];
  local_48 = (uint)(*(char *)(local_10 + 0x24df0) == '\x02');
  if (local_48 == 0) {
    local_51 = tx_size_from_tx_mode(local_21,*(TX_MODE *)(local_10 + 0x24df0));
    local_4c = (uint)local_51;
    local_50 = 2;
  }
  else {
    local_4c = (uint)local_41;
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_21];
    bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_21];
    is_inter = is_inter_block((MB_MODE_INFO *)
                              CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710));
    local_50 = get_search_init_depth
                         ((uint)bVar1,(uint)bVar2,is_inter,(SPEED_FEATURES *)(local_8 + 0x608c0),
                          (uint)*(byte *)(local_40 + 0x18));
    if (((local_50 == 2) && ((*(byte *)(local_8 + 0x426f0) & 1) == 0)) &&
       (""[(int)local_4c] == '\x04')) {
      local_4c = (uint)""[(int)local_4c];
    }
  }
  local_58 = 0;
  local_859 = local_41;
  local_868 = 0x7fffffffffffffff;
  local_86c = bsize_to_num_blk(local_21);
  *(undefined1 *)(local_10 + 0x1c63c) = 0;
  local_888[0] = 0x7fffffffffffffff;
  local_888[1] = 0x7fffffffffffffff;
  local_888[2] = 0x7fffffffffffffff;
  local_890 = local_10 + 0x24e08;
  local_894 = local_4c;
  for (local_898 = local_50; local_898 < 3; local_898 = local_898 + 1) {
    if ((((*(byte *)(local_8 + 0x426f0) & 1) != 0) || (""[(int)local_894] != '\x04')) &&
       (((*(byte *)(local_8 + 0x426f2) & 1) != 0 ||
        (tx_size_wide[(int)local_894] == tx_size_high[(int)local_894])))) {
      if (*(char *)(local_40 + 0x34) == '\x02') break;
      local_8d1 = (*(byte *)(local_8 + 0x60c14) & 1) != 0 && local_894 == local_4c;
      *(bool *)(local_40 + 0x35) = local_8d1;
      iVar3 = uniform_txfm_yrd(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                               in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e6,
                               in_stack_fffffffffffff820,in_stack_fffffffffffff828);
      local_888[local_898] = iVar3;
      if (local_888[local_898] < local_868) {
        memcpy(local_858,(void *)(local_890 + 1),(long)local_86c);
        memcpy(local_458,*(void **)(local_30 + 0x1ee8),(long)local_86c);
        local_859 = (byte)local_894;
        local_868 = local_888[local_898];
        memcpy(local_18,local_8c0,0x28);
      }
      if ((local_894 == 0) ||
         (((local_50 < local_898 && (local_898 != 2)) &&
          ((*(uint *)(local_10 + 0x25640) < 0x100 &&
           ((local_888[local_898 + -1] != 0x7fffffffffffffff &&
            (local_888[local_898 + -1] < local_888[local_898])))))))) break;
    }
    local_894 = (uint)""[(int)local_894];
  }
  if (local_18->rate != 0x7fffffff) {
    *(byte *)(local_38 + 0x91) = local_859;
    memcpy(*(void **)(local_30 + 0x1ee8),local_458,(long)local_86c);
    memcpy((void *)(local_890 + 1),local_858,(long)local_86c);
  }
  *(undefined1 *)(local_40 + 0x35) = 0;
  *(undefined1 *)(local_40 + 0x34) = 0;
  return;
}

Assistant:

static inline void choose_tx_size_type_from_rd(const AV1_COMP *const cpi,
                                               MACROBLOCK *x,
                                               RD_STATS *rd_stats,
                                               int64_t ref_best_rd,
                                               BLOCK_SIZE bs) {
  av1_invalid_rd_stats(rd_stats);

  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  TxfmSearchParams *const txfm_params = &x->txfm_search_params;
  const TX_SIZE max_rect_tx_size = max_txsize_rect_lookup[bs];
  const int tx_select = txfm_params->tx_mode_search_type == TX_MODE_SELECT;
  int start_tx;
  // The split depth can be at most MAX_TX_DEPTH, so the init_depth controls
  // how many times of splitting is allowed during the RD search.
  int init_depth;

  if (tx_select) {
    start_tx = max_rect_tx_size;
    init_depth = get_search_init_depth(mi_size_wide[bs], mi_size_high[bs],
                                       is_inter_block(mbmi), &cpi->sf,
                                       txfm_params->tx_size_search_method);
    if (init_depth == MAX_TX_DEPTH && !cpi->oxcf.txfm_cfg.enable_tx64 &&
        txsize_sqr_up_map[start_tx] == TX_64X64) {
      start_tx = sub_tx_size_map[start_tx];
    }
  } else {
    const TX_SIZE chosen_tx_size =
        tx_size_from_tx_mode(bs, txfm_params->tx_mode_search_type);
    start_tx = chosen_tx_size;
    init_depth = MAX_TX_DEPTH;
  }

  const int skip_trellis = 0;
  uint8_t best_txk_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  TX_SIZE best_tx_size = max_rect_tx_size;
  int64_t best_rd = INT64_MAX;
  const int num_blks = bsize_to_num_blk(bs);
  x->rd_model = FULL_TXFM_RD;
  int64_t rd[MAX_TX_DEPTH + 1] = { INT64_MAX, INT64_MAX, INT64_MAX };
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  for (int tx_size = start_tx, depth = init_depth; depth <= MAX_TX_DEPTH;
       depth++, tx_size = sub_tx_size_map[tx_size]) {
    if ((!cpi->oxcf.txfm_cfg.enable_tx64 &&
         txsize_sqr_up_map[tx_size] == TX_64X64) ||
        (!cpi->oxcf.txfm_cfg.enable_rect_tx &&
         tx_size_wide[tx_size] != tx_size_high[tx_size])) {
      continue;
    }

#if !CONFIG_REALTIME_ONLY
    if (txfm_params->nn_prune_depths_for_intra_tx == TX_PRUNE_SPLIT) break;

    // Set the flag to enable the evaluation of NN classifier to prune transform
    // depths. As the features are based on intra residual information of
    // largest transform, the evaluation of NN model is enabled only for this
    // case.
    txfm_params->enable_nn_prune_intra_tx_depths =
        (cpi->sf.tx_sf.prune_intra_tx_depths_using_nn && tx_size == start_tx);
#endif

    RD_STATS this_rd_stats;
    // When the speed feature use_rd_based_breakout_for_intra_tx_search is
    // enabled, use the known minimum best_rd for early termination.
    const int64_t rd_thresh =
        cpi->sf.tx_sf.use_rd_based_breakout_for_intra_tx_search
            ? AOMMIN(ref_best_rd, best_rd)
            : ref_best_rd;
    rd[depth] = uniform_txfm_yrd(cpi, x, &this_rd_stats, rd_thresh, bs, tx_size,
                                 FTXS_NONE, skip_trellis);
    if (rd[depth] < best_rd) {
      av1_copy_array(best_blk_skip, txfm_info->blk_skip, num_blks);
      av1_copy_array(best_txk_type_map, xd->tx_type_map, num_blks);
      best_tx_size = tx_size;
      best_rd = rd[depth];
      *rd_stats = this_rd_stats;
    }
    if (tx_size == TX_4X4) break;
    // If we are searching three depths, prune the smallest size depending
    // on rd results for the first two depths for low contrast blocks.
    if (depth > init_depth && depth != MAX_TX_DEPTH &&
        x->source_variance < 256) {
      if (rd[depth - 1] != INT64_MAX && rd[depth] > rd[depth - 1]) break;
    }
  }

  if (rd_stats->rate != INT_MAX) {
    mbmi->tx_size = best_tx_size;
    av1_copy_array(xd->tx_type_map, best_txk_type_map, num_blks);
    av1_copy_array(txfm_info->blk_skip, best_blk_skip, num_blks);
  }

#if !CONFIG_REALTIME_ONLY
  // Reset the flags to avoid any unintentional evaluation of NN model and
  // consumption of prune depths.
  txfm_params->enable_nn_prune_intra_tx_depths = false;
  txfm_params->nn_prune_depths_for_intra_tx = TX_PRUNE_NONE;
#endif
}